

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Example.cc
# Opt level: O1

int __thiscall ResultHandler::handle(ResultHandler *this,Observables *observables,Values *results)

{
  long lVar1;
  ostream *poVar2;
  int iVar3;
  ulong uVar4;
  long *local_58;
  long local_50;
  long local_48 [2];
  ResultHandler *local_38;
  
  lVar1 = *(long *)results;
  local_38 = this;
  if (*(long *)(results + 8) != lVar1) {
    uVar4 = 0;
    do {
      poVar2 = std::ostream::_M_insert<double>(*(double *)(lVar1 + uVar4 * 8));
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      (*(observables->
        super__Vector_base<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>).
        _M_impl.super__Vector_impl_data._M_start[uVar4]->_vptr_Observable[1])(&local_58);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_58,local_50);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if (local_58 != local_48) {
        operator_delete(local_58,local_48[0] + 1);
      }
      uVar4 = uVar4 + 1;
      lVar1 = *(long *)results;
    } while (uVar4 < (ulong)(*(long *)(results + 8) - lVar1 >> 3));
  }
  iVar3 = local_38->m_callcount + 1;
  local_38->m_callcount = iVar3;
  return (int)(iVar3 == local_38->m_maxcall);
}

Assistant:

int handle(const SSM::Observables& observables,
	     const SSM::Values& results)
  {
    for(int i(0); i<results.size(); i++)
      std::cout << results[i] << " " 
		<< observables[i]->unit() << std::endl;
    
    m_callcount +=1;

    if(m_callcount==m_maxcall)
      return 1;
    
    return 0;
  }